

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O3

WJTL_STATUS TestDictionaries(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  WJTL_STATUS WVar15;
  WJTL_STATUS WVar16;
  WJTL_STATUS WVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  WJTL_STATUS WVar20;
  WJTL_STATUS WVar21;
  WJTL_STATUS WVar22;
  WJTL_STATUS WVar23;
  WJTL_STATUS WVar24;
  WJTL_STATUS WVar25;
  WJTL_STATUS WVar26;
  WJTL_STATUS WVar27;
  WJTL_STATUS WVar28;
  WJTL_STATUS WVar29;
  WJTL_STATUS WVar30;
  WJTL_STATUS WVar31;
  WJTL_STATUS WVar32;
  WJTL_STATUS WVar33;
  size_t ErrorAtPos;
  undefined7 in_register_00000039;
  bool bVar34;
  bool Condition;
  size_t local_78;
  
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item1\":1,\"item2\":2,\"item3\":3 }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1,\\\"item2\\\":2,\\\"item3\\\":3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d0);
  WVar2 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item3\":3,\"item2\":2,\"item1\":1 }",3);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item3\\\":3,\\\"item2\\\":2,\\\"item1\\\":1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d1);
  WVar3 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { \"item1\" : 1, \"item2\" : 2 }",2);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"item1\\\" : 1, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d2);
  WVar4 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { }",0);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d3);
  WVar5 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }",3);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item1\\\":\\\"1\\\",\\\"item2\\\":\\\"2\\\",\\\"item3\\\":\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d6);
  WVar6 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }",3);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item3\\\":\\\"3\\\",\\\"item2\\\":\\\"2\\\",\\\"item1\\\":\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d7);
  WVar7 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5," { \"item1\" : \"1\", \"item2\" : \"2\" }",2);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \\\"item1\\\" : \\\"1\\\", \\\"item2\\\" : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d8);
  WVar8 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { }",0);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d9);
  WVar9 = VerifyJsonParsesAsDictionaryOfNumbers
                    (IsJson5,
                     " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }",2)
  ;
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":\\\"String\\\", \\\"item1\\\" : 1, \\\"dummy2\\\":12345, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dc);
  WVar10 = VerifyJsonParsesAsDictionaryOfNumbers
                     (IsJson5,
                      " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }"
                      ,2);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":{\\\"sub1\\\":true,\\\"sub2\\\":[{\\\"aa\\\":\\\"bb\\\"}, 1,2,3,4,5]}, \\\"item1\\\":1,  \\\"item2\\\":2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dd);
  if ((int)CONCAT71(in_register_00000039,IsJson5) == 0) {
    WVar11 = VerifyJsonUnableToParse(false,"{\"item1\":1, }",0xc);
    WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1, }\", 12 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40b);
    local_78 = 0xd;
    WVar12 = VerifyJsonUnableToParse(false,"{\"item1\":1 , }",0xd);
    WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1 , }\", 13 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40c);
    bVar34 = WVar12 == WJTL_STATUS_SUCCESS && WVar11 == WJTL_STATUS_SUCCESS;
    ErrorAtPos = 2;
  }
  else {
    WVar11 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\'item1\':1,\'item2\':2,\'item3\':3 }",3);
    WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item1\':1,\'item2\':2,\'item3\':3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e2);
    WVar12 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\'item3\':3,\'item2\':2,\'item1\':1 }",3);
    WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item3\':3,\'item2\':2,\'item1\':1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e3);
    WVar13 = VerifyJsonParsesAsDictionaryOfNumbers(true," { \'item1\' : 1, \'item2\' : 2 }",2);
    WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'item1\' : 1, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e4);
    WVar14 = VerifyJsonParsesAsDictionaryOfNumbers(true," { }",0);
    WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e5);
    WVar15 = VerifyJsonParsesAsDictionaryOfStrings
                       (true,"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }",3);
    WjTestLib_Assert(WVar15 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",1000);
    WVar16 = VerifyJsonParsesAsDictionaryOfStrings
                       (true,"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }",3);
    WjTestLib_Assert(WVar16 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e9);
    WVar17 = VerifyJsonParsesAsDictionaryOfStrings
                       (true," { \'item1\' : \'1\', \'item2\' : \'2\' }",2);
    WjTestLib_Assert(WVar17 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \'item1\' : \'1\', \'item2\' : \'2\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ea);
    WVar18 = VerifyJsonParsesAsDictionaryOfStrings(true," { }",0);
    WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3eb);
    WVar19 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }"
                        ,2);
    WjTestLib_Assert(WVar19 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ee);
    WVar20 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }"
                        ,2);
    WjTestLib_Assert(WVar20 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ef);
    WVar21 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item1:1,item2:2,item3:3 }",3);
    WjTestLib_Assert(WVar21 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item1:1,item2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f2);
    WVar22 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item\\u0031:1,it\\u0065m2:2,item3:3 }",3);
    WjTestLib_Assert(WVar22 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item\\\\u0031:1,it\\\\u0065m2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f3);
    WVar23 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{item3:3,item2:2,item1:1 }",3);
    WjTestLib_Assert(WVar23 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item3:3,item2:2,item1:1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f4);
    WVar24 = VerifyJsonParsesAsDictionaryOfNumbers(true," { item1 : 1, item2 : 2 }",2);
    WjTestLib_Assert(WVar24 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { item1 : 1, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f5);
    WVar25 = VerifyJsonParsesAsDictionaryOfNumbers(true," { }",0);
    WjTestLib_Assert(WVar25 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f6);
    WVar26 = VerifyJsonParsesAsDictionaryOfStrings(true,"{item1:\"1\",item2:\"2\",item3:\"3\" }",3);
    WjTestLib_Assert(WVar26 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item1:\\\"1\\\",item2:\\\"2\\\",item3:\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f9);
    WVar27 = VerifyJsonParsesAsDictionaryOfStrings(true,"{item3:\"3\",item2:\"2\",item1:\"1\" }",3);
    WjTestLib_Assert(WVar27 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item3:\\\"3\\\",item2:\\\"2\\\",item1:\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fa);
    WVar28 = VerifyJsonParsesAsDictionaryOfStrings(true," { item1 : \"1\", item2 : \"2\" }",2);
    WjTestLib_Assert(WVar28 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { item1 : \\\"1\\\", item2 : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fb);
    WVar29 = VerifyJsonParsesAsDictionaryOfStrings(true," { }",0);
    WjTestLib_Assert(WVar29 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fc);
    WVar30 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true," { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }",2);
    WjTestLib_Assert(WVar30 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:\\\"String\\\", item1 : 1, dummy2:12345, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ff);
    WVar31 = VerifyJsonParsesAsDictionaryOfNumbers
                       (true,
                        " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }",2
                       );
    WjTestLib_Assert(WVar31 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:{sub1:true,sub2:[{aa:\\\"bb\\\"}, 1,2,3,4,5]}, item1:1,  item2:2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x400);
    WVar32 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\"item1\":1, }",1);
    WjTestLib_Assert(WVar32 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1, }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x406);
    WVar33 = VerifyJsonParsesAsDictionaryOfNumbers(true,"{\"item1\":1 , }",1);
    WjTestLib_Assert(WVar33 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1 , }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x407);
    bVar34 = ((((WVar31 == WJTL_STATUS_SUCCESS && WVar32 == WJTL_STATUS_SUCCESS) &&
               WVar33 == WJTL_STATUS_SUCCESS) &&
              ((WVar29 == WJTL_STATUS_SUCCESS && WVar30 == WJTL_STATUS_SUCCESS) &&
              (WVar28 == WJTL_STATUS_SUCCESS && WVar27 == WJTL_STATUS_SUCCESS))) &&
             ((((WVar23 == WJTL_STATUS_SUCCESS && WVar24 == WJTL_STATUS_SUCCESS) &&
               WVar25 == WJTL_STATUS_SUCCESS) &&
              ((WVar21 == WJTL_STATUS_SUCCESS && WVar22 == WJTL_STATUS_SUCCESS) &&
              (WVar20 == WJTL_STATUS_SUCCESS && WVar19 == WJTL_STATUS_SUCCESS))) &&
             WVar26 == WJTL_STATUS_SUCCESS)) &&
             ((((WVar15 == WJTL_STATUS_SUCCESS && WVar16 == WJTL_STATUS_SUCCESS) &&
               WVar17 == WJTL_STATUS_SUCCESS) &&
              ((WVar13 == WJTL_STATUS_SUCCESS && WVar14 == WJTL_STATUS_SUCCESS) &&
              (WVar12 == WJTL_STATUS_SUCCESS && WVar11 == WJTL_STATUS_SUCCESS))) &&
             WVar18 == WJTL_STATUS_SUCCESS);
    ErrorAtPos = 0xb;
    local_78 = 0x12;
  }
  WVar11 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"item2\":2,, \"item3\":3 }",0x17);
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"item2\\\":2,, \\\"item3\\\":3 }\", 23 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x410);
  WVar12 = VerifyJsonUnableToParse(IsJson5,"{ ,\"item1\":1, \"item2\":2, \"item3\":3 }",2);
  WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ ,\\\"item1\\\":1, \\\"item2\\\":2, \\\"item3\\\":3 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x411);
  WVar13 = VerifyJsonUnableToParse(IsJson5,"{ BareWord }",ErrorAtPos);
  WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ BareWord }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x412);
  WVar14 = VerifyJsonUnableToParse(IsJson5,"{ \"string\" }",0xb);
  WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"string\\\" }\", 11 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x413);
  WVar15 = VerifyJsonUnableToParse(IsJson5,"{ \'string\' }",ErrorAtPos);
  WjTestLib_Assert(WVar15 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'string\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x414);
  WVar16 = VerifyJsonUnableToParse(IsJson5,"{ 123 }",2);
  WjTestLib_Assert(WVar16 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ 123 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x415);
  WVar17 = VerifyJsonUnableToParse(IsJson5,"{ [1,2,3] }",2);
  WjTestLib_Assert(WVar17 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ [1,2,3] }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x416);
  WVar18 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, true }",local_78);
  WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, true }\", IsJson5 ? 18 :13 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x417);
  WVar19 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"string\", \"item2\":2 }",0x15);
  WjTestLib_Assert(WVar19 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"string\\\", \\\"item2\\\":2 }\", 21 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x418);
  WVar20 = VerifyJsonUnableToParse(IsJson5,"{ \'key\" : \'value\' }",ErrorAtPos);
  WjTestLib_Assert(WVar20 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\\\" : \'value\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x419);
  if (IsJson5) {
    WVar21 = VerifyJsonUnableToParse(true,"{ bare space: \"value\" }",7);
    Condition = WVar21 == WJTL_STATUS_SUCCESS;
    WjTestLib_Assert(Condition,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ bare space: \\\"value\\\" }\", 7 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x41d);
  }
  else {
    WVar21 = VerifyJsonUnableToParse(false,"{ \'key\' : \"value\" }",2);
    WjTestLib_Assert(WVar21 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \\\"value\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x421);
    WVar22 = VerifyJsonUnableToParse(false,"{ \"key\" : \'value\' }",10);
    WjTestLib_Assert(WVar22 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"key\\\" : \'value\' }\", 10 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x422);
    WVar23 = VerifyJsonUnableToParse(false,"{ \'key\' : \'value\' }",2);
    WjTestLib_Assert(WVar23 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \'value\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x423);
    Condition = (WVar22 == WJTL_STATUS_SUCCESS && WVar21 == WJTL_STATUS_SUCCESS) &&
                WVar23 == WJTL_STATUS_SUCCESS;
  }
  WVar21 = WJTL_STATUS_SUCCESS;
  if ((WVar10 != WJTL_STATUS_SUCCESS || WVar9 != WJTL_STATUS_SUCCESS) ||
      ((((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
        WVar7 != WJTL_STATUS_SUCCESS) ||
       ((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
       (WVar2 != WJTL_STATUS_SUCCESS || WVar1 != WJTL_STATUS_SUCCESS))) ||
      WVar8 != WJTL_STATUS_SUCCESS)) {
    WVar21 = WJTL_STATUS_FAILED;
  }
  if (!bVar34) {
    WVar21 = WJTL_STATUS_FAILED;
  }
  if (((((WVar15 != WJTL_STATUS_SUCCESS || WVar16 != WJTL_STATUS_SUCCESS) ||
        WVar17 != WJTL_STATUS_SUCCESS) ||
       ((WVar13 != WJTL_STATUS_SUCCESS || WVar14 != WJTL_STATUS_SUCCESS) ||
       (WVar12 != WJTL_STATUS_SUCCESS || WVar11 != WJTL_STATUS_SUCCESS))) ||
      WVar18 != WJTL_STATUS_SUCCESS) ||
      (WVar20 != WJTL_STATUS_SUCCESS || WVar19 != WJTL_STATUS_SUCCESS)) {
    WVar21 = WJTL_STATUS_FAILED;
  }
  if (!Condition) {
    WVar21 = WJTL_STATUS_FAILED;
  }
  return WVar21;
}

Assistant:

static
WJTL_STATUS
    TestDictionaries
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test dictionary of numbers
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1,\"item2\":2,\"item3\":3 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item3\":3,\"item2\":2,\"item1\":1 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"item1\" : 1, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

    // Test dictionary of strings
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { \"item1\" : \"1\", \"item2\" : \"2\" }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

    // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }", 2 ) );

    if( IsJson5 )
    {
        // Test Json5 single quoted keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item1':1,'item2':2,'item3':3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item3':3,'item2':2,'item1':1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'item1' : 1, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item1':'1','item2':'2','item3':'3' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item3':'3','item2':'2','item1':'1' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { 'item1' : '1', 'item2' : '2' }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':'String', 'item1' : 1, 'dummy2':12345, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':{'sub1':true,'sub2':[{'aa':'bb'}, 1,2,3,4,5]}, 'item1':1,  'item2':2 }", 2 ) );

        // Test Json5 bareword keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item1:1,item2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item\\u0031:1,it\\u0065m2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item3:3,item2:2,item1:1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { item1 : 1, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item1:\"1\",item2:\"2\",item3:\"3\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item3:\"3\",item2:\"2\",item1:\"1\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { item1 : \"1\", item2 : \"2\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }", 2 ) );
    }

    // Test trailing commas for Json5
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1, }", 1 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1 , }", 1 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1, }", 12 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1 , }", 13 ) );
    }

    // Test invalid dictionaries
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"item2\":2,, \"item3\":3 }", 23 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ ,\"item1\":1, \"item2\":2, \"item3\":3 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ BareWord }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"string\" }", 11 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'string' }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 123 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ [1,2,3] }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, true }", IsJson5 ? 18 :13 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"string\", \"item2\":2 }", 21 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key\" : 'value' }", IsJson5 ? 11 : 2 ) );

    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ bare space: \"value\" }", 7 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : \"value\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"key\" : 'value' }", 10 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : 'value' }", 2 ) );
    }

    return TestReturn;
}